

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O0

Session * __thiscall FIX::Initiator::getSession(Initiator *this,SessionID *sessionID)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator i;
  SessionID *sessionID_local;
  Initiator *this_local;
  
  i._M_node = (_Base_ptr)sessionID;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
       ::find(&this->m_sessions,sessionID);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
       ::end(&this->m_sessions);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::
             operator->(&local_28);
    this_local = (Initiator *)ppVar2->second;
  }
  else {
    this_local = (Initiator *)0x0;
  }
  return (Session *)this_local;
}

Assistant:

Session* Initiator::getSession( const SessionID& sessionID ) const
{
  Sessions::const_iterator i = m_sessions.find( sessionID );
  if( i != m_sessions.end() )
    return i->second;
  else
    return 0;
}